

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qemulationpaintengine.cpp
# Opt level: O2

void combineXForm(QBrush *brush,QRectF *r)

{
  CoordinateMode CVar1;
  QGradient *pQVar2;
  long lVar3;
  QTransform *pQVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QTransform QStack_108;
  QTransform local_b8;
  QTransform local_68;
  long local_18;
  
  bVar9 = 0;
  pQVar4 = &QStack_108;
  pQVar6 = &QStack_108;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar5 = (qreal *)&DAT_005e8850;
  pqVar7 = (qreal *)&local_68;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pqVar7 = *pqVar5;
    pqVar5 = pqVar5 + 1;
    pqVar7 = pqVar7 + 1;
  }
  local_68.m_matrix[0][0] = r->w;
  local_68.m_matrix[1][1] = r->h;
  local_68.m_matrix[0][1] = 0.0;
  local_68.m_matrix[0][2] = 0.0;
  local_68.m_matrix[1][0] = 0.0;
  local_68.m_matrix[1][2] = 0.0;
  local_68.m_matrix[2][0] = r->xp;
  local_68.m_matrix[2][1] = r->yp;
  local_68.m_matrix[2][2] = 1.0;
  local_68._72_2_ = 0xa900;
  pQVar2 = QBrush::gradient(brush);
  if (pQVar2 != (QGradient *)0x0) {
    pQVar2 = QBrush::gradient(brush);
    CVar1 = QGradient::coordinateMode(pQVar2);
    if (CVar1 != ObjectMode) {
      pQVar6 = &((brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                 super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                 super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->transform;
      pQVar8 = &QStack_108;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)pQVar8 = pQVar6->m_matrix[0][0];
        pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
        pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      pQVar6 = &local_68;
      goto LAB_0034c824;
    }
  }
  pQVar4 = &((brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->transform;
  pQVar8 = &QStack_108;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pQVar8 = pQVar4->m_matrix[0][0];
    pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar9 * -2 + 1) * 8);
    pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  pQVar4 = &local_68;
LAB_0034c824:
  QTransform::operator*(&local_b8,pQVar6,pQVar4);
  QBrush::setTransform(brush,&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void combineXForm(QBrush *brush, const QRectF &r)
{
    QTransform t(r.width(), 0, 0, r.height(), r.x(), r.y());
    if (brush->gradient() && brush->gradient()->coordinateMode() != QGradient::ObjectMode)
        brush->setTransform(t * brush->transform()); // compat mode
    else
        brush->setTransform(brush->transform() * t);
}